

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * phyr::Transform::perspective(double fov,double near,double far)

{
  double dVar1;
  Transform *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double invTan;
  Mat4x4 persMat;
  Mat4x4 *mat;
  Transform *this;
  Transform *in_stack_fffffffffffffe18;
  Transform *in_stack_fffffffffffffe20;
  double in_stack_fffffffffffffe50;
  double in_stack_fffffffffffffe58;
  double in_stack_fffffffffffffe60;
  _Mat4x4 local_98;
  double local_8;
  
  local_8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  mat = (Mat4x4 *)0x0;
  this = (Transform *)0x0;
  _Mat4x4::_Mat4x4(&local_98,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,
                   in_XMM2_Qa / (in_XMM2_Qa - in_XMM1_Qa),
                   (-in_XMM2_Qa * in_XMM1_Qa) / (in_XMM2_Qa - in_XMM1_Qa),0.0,0.0,1.0,0.0);
  dVar1 = radians(local_8);
  tan(dVar1 / 2.0);
  scale(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Transform(this,mat);
  operator*(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  return in_RDI;
}

Assistant:

Transform Transform::perspective(Real fov, Real near, Real far) {
    // Matrix for projective divide
    Mat4x4 persMat(1, 0,                  0,                          0,
                   0, 1,                  0,                          0,
                   0, 0, far / (far - near), -far * near / (far - near),
                   0, 0,                  1,                          0);

    // Apply fov factor
    Real invTan = 1 / std::tan(radians(fov) / 2);
    return Transform::scale(invTan, invTan, 1) * Transform(persMat);
}